

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qversionnumber.h
# Opt level: O1

bool __thiscall QVersionNumber::isPrefixOf(QVersionNumber *this,QVersionNumber *other)

{
  byte bVar1;
  byte bVar2;
  QList<int> *pQVar3;
  QList<int> *pQVar4;
  char cVar5;
  bool bVar6;
  long lVar7;
  qsizetype i;
  long lVar8;
  int iVar9;
  qsizetype qVar10;
  int iVar11;
  
  bVar1 = (this->m_segments).field_0.inline_segments[0];
  cVar5 = (char)bVar1 >> 1;
  if ((bVar1 & 1) == 0) {
    lVar8 = (((this->m_segments).field_0.pointer_segments)->d).size;
  }
  else {
    lVar8 = (long)cVar5;
  }
  bVar2 = (other->m_segments).field_0.inline_segments[0];
  if ((bVar2 & 1) == 0) {
    qVar10 = (((other->m_segments).field_0.pointer_segments)->d).size;
  }
  else {
    qVar10 = (qsizetype)((char)bVar2 >> 1);
  }
  if (qVar10 < lVar8) {
    bVar6 = false;
  }
  else {
    pQVar3 = (this->m_segments).field_0.pointer_segments;
    pQVar4 = (other->m_segments).field_0.pointer_segments;
    lVar8 = 0;
    do {
      lVar7 = (long)cVar5;
      if ((bVar1 & 1) == 0) {
        lVar7 = (pQVar3->d).size;
      }
      bVar6 = lVar7 <= lVar8;
      if (lVar7 <= lVar8) {
        return bVar6;
      }
      qVar10 = (long)cVar5;
      if ((bVar1 & 1) == 0) {
        qVar10 = (pQVar3->d).size;
      }
      iVar9 = 0;
      if (lVar8 < qVar10) {
        if ((bVar1 & 1) == 0) {
          iVar9 = (pQVar3->d).ptr[lVar8];
        }
        else {
          iVar9 = (int)(this->m_segments).field_0.inline_segments[lVar8 + 1];
        }
      }
      qVar10 = (long)((char)bVar2 >> 1);
      if ((bVar2 & 1) == 0) {
        qVar10 = (pQVar4->d).size;
      }
      iVar11 = 0;
      if (lVar8 < qVar10) {
        if ((bVar2 & 1) == 0) {
          iVar11 = (pQVar4->d).ptr[lVar8];
        }
        else {
          iVar11 = (int)(other->m_segments).field_0.inline_segments[lVar8 + 1];
        }
      }
      lVar8 = lVar8 + 1;
    } while (iVar9 == iVar11);
  }
  return bVar6;
}

Assistant:

qsizetype size() const noexcept
        { return isUsingPointer() ? pointer_segments->size() : (inline_segments[InlineSegmentMarker] >> 1); }